

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O1

void Dar_BalanceUniqify(Aig_Obj_t *pObj,Vec_Ptr_t *vNodes,int fExor)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar7;
  ulong uVar8;
  uint uVar6;
  
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Dar_ObjCompareLits);
  }
  uVar1 = vNodes->nSize;
  uVar8 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      if ((int)uVar5 < 0) {
LAB_0048784c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar2 = vNodes->pArray;
      pvVar7 = ppvVar2[uVar5];
      uVar6 = uVar5 + 1;
      uVar4 = (uint)uVar8;
      if (uVar6 == uVar1) {
        if (uVar1 <= uVar4) {
LAB_0048788a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        uVar4 = uVar4 + 1;
        ppvVar2[uVar8] = pvVar7;
        break;
      }
      if ((int)uVar1 <= (int)uVar6) goto LAB_0048784c;
      if ((fExor == 0) && (pvVar7 == (void *)((ulong)ppvVar2[uVar6] ^ 1))) {
        vNodes->nSize = 0;
        return;
      }
      if (pvVar7 == ppvVar2[uVar6]) {
        if (fExor == 0) {
          uVar6 = uVar5;
        }
      }
      else {
        if (uVar1 <= uVar4) goto LAB_0048788a;
        ppvVar2[uVar8] = pvVar7;
        uVar8 = (ulong)(uVar4 + 1);
        uVar6 = uVar5;
      }
      uVar4 = (uint)uVar8;
      uVar5 = uVar6 + 1;
    } while ((int)uVar5 < (int)uVar1);
  }
  if ((int)uVar1 < (int)uVar4) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  vNodes->nSize = uVar4;
  if (1 < (int)uVar4) {
    uVar8 = 1;
    pvVar7 = *vNodes->pArray;
    do {
      pvVar3 = vNodes->pArray[uVar8];
      if (pvVar7 == pvVar3) {
        __assert_fail("pTemp != pTempNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                      ,0x5a,"void Dar_BalanceUniqify(Aig_Obj_t *, Vec_Ptr_t *, int)");
      }
      uVar8 = uVar8 + 1;
      pvVar7 = pvVar3;
    } while (uVar4 != uVar8);
  }
  return;
}

Assistant:

void Dar_BalanceUniqify( Aig_Obj_t * pObj, Vec_Ptr_t * vNodes, int fExor )
{
    Aig_Obj_t * pTemp, * pTempNext;
    int i, k;
    // sort the nodes by their literal
    Vec_PtrSort( vNodes, (int (*)())Dar_ObjCompareLits );
    // remove duplicates
    k = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pTemp, i )
    {
        if ( i + 1 == Vec_PtrSize(vNodes) )
        {
            Vec_PtrWriteEntry( vNodes, k++, pTemp );
            break;
        }
        pTempNext = (Aig_Obj_t *)Vec_PtrEntry( vNodes, i+1 );
        if ( !fExor && pTemp == Aig_Not(pTempNext) ) // pos_lit & neg_lit = 0
        {
            Vec_PtrClear( vNodes );
            return;
        }
        if ( pTemp != pTempNext )  // save if different
            Vec_PtrWriteEntry( vNodes, k++, pTemp );
        else if ( fExor ) // in case of XOR, remove identical
            i++;
    }
    Vec_PtrShrink( vNodes, k );
    if ( Vec_PtrSize(vNodes) < 2 )
        return;
    // check that there is no duplicates
    pTemp = (Aig_Obj_t *)Vec_PtrEntry( vNodes, 0 );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, vNodes, pTempNext, i, 1 )
    {
        assert( pTemp != pTempNext );
        pTemp = pTempNext;
    }
}